

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_adaptive_eval_grid.h
# Opt level: O2

void __thiscall
embree::sse2::FeatureAdaptiveEvalGrid::FeatureAdaptiveEvalGrid
          (FeatureAdaptiveEvalGrid *this,GeneralCatmullClarkPatch3fa *patch,uint subPatch,uint x0,
          uint x1,uint y0,uint y1,uint swidth,uint sheight,float *Px,float *Py,float *Pz,float *U,
          float *V,float *Nx,float *Ny,float *Nz,uint dwidth,uint dheight)

{
  GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *pGVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  BBox2f srange3;
  BBox2f srange1;
  array_t<embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>,_16UL> patches;
  uint local_d144;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_d140;
  float fStack_d138;
  float fStack_d134;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_d130;
  float local_d128;
  float fStack_d124;
  float local_d120;
  float fStack_d11c;
  undefined4 uStack_d118;
  undefined4 uStack_d114;
  undefined8 local_d110;
  undefined8 uStack_d108;
  undefined8 local_d100;
  undefined8 uStack_d0f8;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_d0f0;
  uint uStack_d0e8;
  uint uStack_d0e4;
  float local_d0e0;
  float fStack_d0dc;
  undefined8 uStack_d0d8;
  undefined8 local_d0d0;
  float fStack_d0c8;
  float fStack_d0c4;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_d0c0;
  undefined8 uStack_d0b8;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_d0b0;
  float fStack_d0a8;
  float fStack_d0a4;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_d0a0;
  float fStack_d098;
  float fStack_d094;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_d090;
  float fStack_d088;
  float fStack_d084;
  array_t<embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>,_16UL> local_d080;
  
  this->x0 = x0;
  this->x1 = x1;
  this->y0 = y0;
  this->y1 = y1;
  this->swidth = swidth;
  auVar4._4_4_ = 0;
  auVar4._0_4_ = swidth;
  auVar4._8_4_ = sheight;
  auVar4._12_4_ = 0;
  auVar4 = auVar4 | _DAT_01f51230;
  dVar2 = (double)DAT_01f51230;
  dVar3 = DAT_01f51230._8_8_;
  this->sheight = sheight;
  auVar5._4_4_ = (float)(auVar4._8_8_ - dVar3) + -1.0;
  auVar5._0_4_ = (float)(auVar4._0_8_ - dVar2) + -1.0;
  auVar5._8_8_ = 0;
  auVar5 = divps(_DAT_01f46a80,auVar5);
  this->rcp_swidth = (float)(int)auVar5._0_8_;
  this->rcp_sheight = (float)(int)((ulong)auVar5._0_8_ >> 0x20);
  this->Px = Px;
  this->Py = Py;
  this->Pz = Pz;
  this->U = U;
  this->V = V;
  this->Nx = Nx;
  this->Ny = Ny;
  this->Nz = Nz;
  this->dwidth = dwidth;
  this->count = 0;
  local_d128 = (float)(swidth - 1);
  fStack_d124 = (float)(sheight - 1);
  local_d130 = (anon_union_8_2_4062524c_for_Vec2<float>_1)0x0;
  local_d140.field_0.x =
       ((float)(x0 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(x0 & 0xffff | 0x4b000000);
  local_d140.field_0.y =
       ((float)(y0 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(y0 & 0xffff | 0x4b000000);
  fStack_d138 = ((float)(x1 >> 0x10 | 0x53000000) - 5.497642e+11) +
                (float)(x1 & 0xffff | 0x4b000000);
  fStack_d134 = ((float)(y1 >> 0x10 | 0x53000000) - 5.497642e+11) +
                (float)(y1 & 0xffff | 0x4b000000);
  if ((((patch->N == 4) && (pGVar1 = (patch->ring).data, pGVar1->only_quads == true)) &&
      (pGVar1[1].only_quads == true)) &&
     ((pGVar1[2].only_quads == true && (pGVar1[3].only_quads == true)))) {
    array_t<embree::CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>,_4UL>::array_t
              ((array_t<embree::CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>,_4UL> *)
               &local_d080);
    GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>::init
              (patch,(EVP_PKEY_CTX *)&local_d080);
    eval(this,local_d080.items,(BBox2f *)&local_d130.field_0,(BBox2f *)&local_d140.field_0,0,
         (BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0);
    array_t<embree::CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>,_4UL>::~array_t
              ((array_t<embree::CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>,_4UL> *)
               &local_d080);
  }
  else {
    array_t<embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>,_16UL>::array_t(&local_d080);
    GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>::subdivide
              (patch,&local_d080,&local_d144);
    if (local_d144 == 4) {
      local_d0a0.field_0.x = local_d130.field_0.x;
      local_d090.field_0.y = local_d130.field_0.y;
      local_d110 = CONCAT44(fStack_d124,local_d128);
      local_d120 = (local_d0a0.field_0.x + local_d128) * 0.5;
      fStack_d11c = (local_d090.field_0.y + fStack_d124) * 0.5;
      uStack_d118 = 0;
      uStack_d114 = 0;
      local_d0b0.field_0 = local_d130.field_0;
      local_d100 = local_d130.field_0;
      uStack_d0f8 = 0;
      fStack_d088 = local_d128;
      uStack_d108 = 0;
      local_d0d0 = local_d130.field_0;
      fStack_d094 = fStack_d124;
      local_d0e0 = local_d120;
      fStack_d0dc = fStack_d11c;
      uStack_d0d8 = local_d110;
      fStack_d0c8 = local_d120;
      fStack_d0c4 = fStack_d11c;
      local_d0c0.field_0.x = local_d120;
      local_d0c0.field_0.y = fStack_d11c;
      uStack_d0b8 = local_d110;
      fStack_d0a8 = local_d120;
      fStack_d0a4 = fStack_d11c;
      local_d0a0.field_0.y = fStack_d11c;
      fStack_d098 = local_d120;
      local_d090.field_0.x = local_d120;
      fStack_d084 = fStack_d11c;
      GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>::fix_quad_ring_order(&local_d080);
      local_d0f0.field_0.x =
           (float)(~-(uint)((float)local_d0d0 < local_d140.field_0.x) & (uint)(float)local_d100 |
                  (uint)local_d140.field_0.x & -(uint)((float)local_d0d0 < local_d140.field_0.x));
      local_d0f0.field_0.y =
           (float)(~-(uint)(local_d0d0._4_4_ < local_d140.field_0.y) & (uint)local_d100._4_4_ |
                  (uint)local_d140.field_0.y & -(uint)(local_d0d0._4_4_ < local_d140.field_0.y));
      uStack_d0e8 = ~-(uint)(fStack_d0c8 < fStack_d138) & (uint)fStack_d138 |
                    (uint)local_d120 & -(uint)(fStack_d0c8 < fStack_d138);
      uStack_d0e4 = ~-(uint)(fStack_d0c4 < fStack_d134) & (uint)fStack_d134 |
                    (uint)fStack_d11c & -(uint)(fStack_d0c4 < fStack_d134);
      eval(this,local_d080.items,(BBox2f *)&local_d0b0.field_0,(BBox2f *)&local_d0f0.field_0,1,
           (BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0);
      local_d0f0.field_0.x =
           (float)(~-(uint)(local_d120 < local_d140.field_0.x) & (uint)local_d120 |
                  (uint)local_d140.field_0.x & -(uint)(local_d120 < local_d140.field_0.x));
      local_d0f0.field_0.y =
           (float)(~-(uint)(local_d100._4_4_ < local_d140.field_0.y) & (uint)local_d100._4_4_ |
                  (uint)local_d140.field_0.y & -(uint)(local_d100._4_4_ < local_d140.field_0.y));
      uStack_d0e8 = ~-(uint)((float)local_d110 < fStack_d138) & (uint)fStack_d138 |
                    (uint)(float)local_d110 & -(uint)((float)local_d110 < fStack_d138);
      uStack_d0e4 = ~-(uint)(fStack_d11c < fStack_d134) & (uint)fStack_d134 |
                    (uint)fStack_d11c & -(uint)(fStack_d11c < fStack_d134);
      eval(this,local_d080.items + 1,(BBox2f *)&local_d090.field_0,(BBox2f *)&local_d0f0.field_0,1,
           (BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0);
      local_d0f0.field_0.x =
           (float)(~-(uint)(local_d0e0 < local_d140.field_0.x) & (uint)local_d120 |
                  (uint)local_d140.field_0.x & -(uint)(local_d0e0 < local_d140.field_0.x));
      local_d0f0.field_0.y =
           (float)(~-(uint)(fStack_d0dc < local_d140.field_0.y) & (uint)fStack_d11c |
                  (uint)local_d140.field_0.y & -(uint)(fStack_d0dc < local_d140.field_0.y));
      uStack_d0e8 = ~-(uint)((float)uStack_d0d8 < fStack_d138) & (uint)fStack_d138 |
                    (uint)local_d110 & -(uint)((float)uStack_d0d8 < fStack_d138);
      uStack_d0e4 = ~-(uint)(uStack_d0d8._4_4_ < fStack_d134) & (uint)fStack_d134 |
                    (uint)((ulong)local_d110 >> 0x20) & -(uint)(uStack_d0d8._4_4_ < fStack_d134);
      eval(this,local_d080.items + 2,(BBox2f *)&local_d0c0.field_0,(BBox2f *)&local_d0f0.field_0,1,
           (BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0);
      local_d0f0.field_0.x =
           (float)(~-(uint)((float)local_d100 < local_d140.field_0.x) & (uint)(float)local_d100 |
                  (uint)local_d140.field_0.x & -(uint)((float)local_d100 < local_d140.field_0.x));
      local_d0f0.field_0.y =
           (float)(~-(uint)(fStack_d11c < local_d140.field_0.y) & (uint)fStack_d11c |
                  (uint)local_d140.field_0.y & -(uint)(fStack_d11c < local_d140.field_0.y));
      uStack_d0e8 = ~-(uint)(local_d120 < fStack_d138) & (uint)fStack_d138 |
                    (uint)local_d120 & -(uint)(local_d120 < fStack_d138);
      uStack_d0e4 = ~-(uint)(local_d110._4_4_ < fStack_d134) & (uint)fStack_d134 |
                    (uint)local_d110._4_4_ & -(uint)(local_d110._4_4_ < fStack_d134);
      eval(this,local_d080.items + 3,(BBox2f *)&local_d0a0.field_0,(BBox2f *)&local_d0f0.field_0,1,
           (BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0);
    }
    else {
      eval(this,local_d080.items + subPatch,(BBox2f *)&local_d130.field_0,
           (BBox2f *)&local_d140.field_0,1,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,
           (BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0);
    }
    array_t<embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>,_16UL>::~array_t(&local_d080)
    ;
  }
  return;
}

Assistant:

FeatureAdaptiveEvalGrid (const GeneralCatmullClarkPatch3fa& patch, unsigned subPatch,
                               const unsigned x0, const unsigned x1, const unsigned y0, const unsigned y1, const unsigned swidth, const unsigned sheight, 
                               float* Px, float* Py, float* Pz, float* U, float* V, 
                               float* Nx, float* Ny, float* Nz,
                               const unsigned dwidth, const unsigned dheight)
      : x0(x0), x1(x1), y0(y0), y1(y1), swidth(swidth), sheight(sheight), rcp_swidth(1.0f/(swidth-1.0f)), rcp_sheight(1.0f/(sheight-1.0f)), 
        Px(Px), Py(Py), Pz(Pz), U(U), V(V), Nx(Nx), Ny(Ny), Nz(Nz), dwidth(dwidth), /*dheight(dheight),*/ count(0)
      {
        assert(swidth < (2<<20) && sheight < (2<<20));
        const BBox2f srange(Vec2f(0.0f,0.0f),Vec2f(float(swidth-1),float(sheight-1)));
        const BBox2f erange(Vec2f((float)x0,(float)y0),Vec2f((float)x1,(float)y1));
        
        /* convert into standard quad patch if possible */
        if (likely(patch.isQuadPatch())) 
        {
          CatmullClarkPatch3fa qpatch; patch.init(qpatch);
          eval(qpatch, srange, erange, 0);
          assert(count == (x1-x0+1)*(y1-y0+1));
          return;
        }
        
        /* subdivide patch */
        unsigned N;
        array_t<CatmullClarkPatch3fa,GeneralCatmullClarkPatch3fa::SIZE> patches; 
        patch.subdivide(patches,N);
        
        if (N == 4)
        {
          const Vec2f c = srange.center();
          const BBox2f srange0(srange.lower,c);
          const BBox2f srange1(Vec2f(c.x,srange.lower.y),Vec2f(srange.upper.x,c.y));
          const BBox2f srange2(c,srange.upper);
          const BBox2f srange3(Vec2f(srange.lower.x,c.y),Vec2f(c.x,srange.upper.y));

#if PATCH_USE_GREGORY == 2
          BezierCurve3fa borders[GeneralCatmullClarkPatch3fa::SIZE]; patch.getLimitBorder(borders);
          BezierCurve3fa border0l,border0r; borders[0].subdivide(border0l,border0r);
          BezierCurve3fa border1l,border1r; borders[1].subdivide(border1l,border1r);
          BezierCurve3fa border2l,border2r; borders[2].subdivide(border2l,border2r);
          BezierCurve3fa border3l,border3r; borders[3].subdivide(border3l,border3r);
          GeneralCatmullClarkPatch3fa::fix_quad_ring_order(patches);
          eval(patches[0],srange0,intersect(srange0,erange),1,&border0l,nullptr,nullptr,&border3r);
          eval(patches[1],srange1,intersect(srange1,erange),1,&border0r,&border1l,nullptr,nullptr);
          eval(patches[2],srange2,intersect(srange2,erange),1,nullptr,&border1r,&border2l,nullptr);
          eval(patches[3],srange3,intersect(srange3,erange),1,nullptr,nullptr,&border2r,&border3l);
#else
          GeneralCatmullClarkPatch3fa::fix_quad_ring_order(patches);
          eval(patches[0],srange0,intersect(srange0,erange),1);
          eval(patches[1],srange1,intersect(srange1,erange),1);
          eval(patches[2],srange2,intersect(srange2,erange),1);
          eval(patches[3],srange3,intersect(srange3,erange),1);
#endif
        }
        else
        {
          assert(subPatch < N);
          
#if PATCH_USE_GREGORY == 2
          BezierCurve3fa borders[2]; patch.getLimitBorder(borders,subPatch);
          BezierCurve3fa border0l,border0r; borders[0].subdivide(border0l,border0r);
          BezierCurve3fa border2l,border2r; borders[1].subdivide(border2l,border2r);
          eval(patches[subPatch], srange, erange, 1, &border0l, nullptr, nullptr, &border2r);
#else
          eval(patches[subPatch], srange, erange, 1);
#endif
          
        }
        assert(count == (x1-x0+1)*(y1-y0+1));
      }